

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O2

void (anonymous_namespace)::check<Imf_3_2::DeepTiledInputFile,Imf_3_2::DeepTiledOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  bool bVar1;
  __type _Var2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  undefined4 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ostream *poVar8;
  string *psVar9;
  allocator<char> local_8a;
  allocator<char> local_89;
  MultiPartInputFile file_1;
  DeepTiledOutputFile file;
  Header f;
  
  _file = 0;
  Imf_3_2::Header::Header(&f,0x40,0x40,1.0,(Vec2 *)&file,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar5 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&file,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar5,(Channel *)"Dummy");
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          filename,NOTYPEATTR_abi_cxx11_);
  if (bVar1) {
    Imf_3_2::Header::setType((string *)&f);
  }
  puVar6 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar6 = 2;
  _file = 0x2000000020;
  Imf_3_2::Header::setTileDescription((TileDescription *)&f);
  remove("/var/tmp/badfile.exr");
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile(&file,"/var/tmp/badfile.exr",&f,iVar4);
  Imf_3_2::DeepTiledOutputFile::~DeepTiledOutputFile(&file);
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(&file_1,"/var/tmp/badfile.exr",iVar4,true);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          Imf_3_2::DEEPTILE_abi_cxx11_,NOTYPEATTR_abi_cxx11_);
  if (bVar1) {
    Imf_3_2::MultiPartInputFile::header((int)&file_1);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Imf_3_2::Header::type_abi_cxx11_();
    bVar1 = std::operator!=(pbVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)Imf_3_2::DEEPTILE_abi_cxx11_);
    if (bVar1) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error: expected type in header to be ");
      poVar8 = std::operator<<(poVar8,(string *)Imf_3_2::DEEPTILE_abi_cxx11_);
      poVar8 = std::operator<<(poVar8," but got ");
      Imf_3_2::MultiPartInputFile::header((int)&file_1);
      psVar9 = (string *)Imf_3_2::Header::type_abi_cxx11_();
      poVar8 = std::operator<<(poVar8,psVar9);
      poVar8 = std::operator<<(poVar8," from multipart when input type was ");
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              filename,NOTYPEATTR_abi_cxx11_);
      if (_Var2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&file,"unset",&local_89);
      }
      else {
        std::__cxx11::string::string((string *)&file,(string *)filename);
      }
      poVar8 = std::operator<<(poVar8,(string *)&file);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&file);
    }
  }
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          Imf_3_2::DEEPTILE_abi_cxx11_,NOTYPEATTR_abi_cxx11_);
  if (!_Var2) {
    Imf_3_2::MultiPartInputFile::header((int)&file_1);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Imf_3_2::Header::type_abi_cxx11_();
    _Var2 = std::operator==(pbVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)Imf_3_2::DEEPTILE_abi_cxx11_);
    if (!_Var2) {
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepTiledInputFile, OUT = Imf_3_2::DeepTiledOutputFile]"
                   );
    }
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&file_1);
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepTiledInputFile::DeepTiledInputFile
            ((DeepTiledInputFile *)&file_1,"/var/tmp/badfile.exr",iVar4);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          Imf_3_2::DEEPTILE_abi_cxx11_,NOTYPEATTR_abi_cxx11_);
  if (_Var2) {
    Imf_3_2::DeepTiledInputFile::header();
    cVar3 = Imf_3_2::Header::hasType();
    if (cVar3 != '\0') {
      std::operator<<((ostream *)&std::cerr,
                      " type attribute got inserted when it shouldn\'t have been\n");
    }
    Imf_3_2::DeepTiledInputFile::header();
    cVar3 = Imf_3_2::Header::hasType();
    if (cVar3 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepTiledInputFile, OUT = Imf_3_2::DeepTiledOutputFile]"
                   );
    }
  }
  else {
    Imf_3_2::DeepTiledInputFile::header();
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Imf_3_2::Header::type_abi_cxx11_();
    bVar1 = std::operator!=(pbVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)Imf_3_2::DEEPTILE_abi_cxx11_);
    if (bVar1) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error: expected type in header to be ");
      poVar8 = std::operator<<(poVar8,(string *)Imf_3_2::DEEPTILE_abi_cxx11_);
      poVar8 = std::operator<<(poVar8," but got ");
      Imf_3_2::DeepTiledInputFile::header();
      psVar9 = (string *)Imf_3_2::Header::type_abi_cxx11_();
      poVar8 = std::operator<<(poVar8,psVar9);
      poVar8 = std::operator<<(poVar8," when input type was ");
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              filename,NOTYPEATTR_abi_cxx11_);
      if (_Var2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&file,"unset",&local_8a);
      }
      else {
        std::__cxx11::string::string((string *)&file,(string *)filename);
      }
      poVar8 = std::operator<<(poVar8,(string *)&file);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&file);
    }
  }
  Imf_3_2::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)&file_1);
  remove("/var/tmp/badfile.exr");
  Imf_3_2::Header::~Header(&f);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}